

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O1

void __thiscall
fizplex::ColMatrix_AddColumnAndValuesToNonEmptyMatrix_Test::TestBody
          (ColMatrix_AddColumnAndValuesToNonEmptyMatrix_Test *this)

{
  void *pvVar1;
  bool bVar2;
  SVector *rhs;
  long lVar3;
  char *message;
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector::Nonzero> l_02;
  initializer_list<fizplex::SVector> colList;
  AssertionResult gtest_ar;
  SVector new_col;
  ColMatrix m;
  long alStack_140 [3];
  SVector local_128;
  SVector SStack_110;
  SVector local_f8;
  SVector local_d8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Nonzero local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  ColMatrix local_70;
  Nonzero local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_b8 = 1;
  uStack_b0 = 0;
  local_d8.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  uStack_c0 = 0xc008000000000000;
  local_d8.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x401c000000000000;
  alStack_140[2] = 0x15f873;
  l._M_len = 3;
  l._M_array = (iterator)&local_d8;
  SVector::SVector(&local_128,l);
  local_88 = 2;
  uStack_80 = 0x4010000000000000;
  local_98 = 1;
  uStack_90 = 0x4008000000000000;
  local_a8.index = 0;
  local_a8.value = 2.0;
  alStack_140[2] = 0x15f8ad;
  l_00._M_len = 3;
  l_00._M_array = &local_a8;
  SVector::SVector(&SStack_110,l_00);
  local_28 = 2;
  uStack_20 = 0xc000000000000000;
  local_38 = 1;
  puStack_30 = &DAT_bff0000000000000;
  local_48.index = 0;
  local_48.value = 1.0;
  alStack_140[2] = 0x15f8e7;
  l_01._M_len = 3;
  l_01._M_array = &local_48;
  SVector::SVector(&local_f8,l_01);
  alStack_140[2] = 0x15f907;
  colList._M_len = 3;
  colList._M_array = &local_128;
  ColMatrix::ColMatrix(&local_70,3,3,colList);
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)alStack_140 + lVar3);
    if (pvVar1 != (void *)0x0) {
      alStack_140[2] = 0x15f923;
      operator_delete(pvVar1,*(long *)((long)alStack_140 + lVar3 + 0x10) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  SStack_110.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3;
  SStack_110.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  local_128.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  SStack_110.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
  local_128.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_3ff0000000000000;
  alStack_140[2] = 0x15f95b;
  l_02._M_len = 3;
  l_02._M_array = (iterator)&local_128;
  SVector::SVector(&local_d8,l_02);
  alStack_140[2] = 0x15f96d;
  ColMatrix::add_column(&local_70,&local_d8);
  alStack_140[2] = 0x15f97f;
  rhs = ColMatrix::column(&local_70,3);
  alStack_140[2] = 0x15f99d;
  testing::internal::CmpHelperEQ<fizplex::SVector,fizplex::SVector>
            ((internal *)&local_128,"new_col","m.column(3)",&local_d8,rhs);
  if (local_128.values.
      super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
      _M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    alStack_140[2] = 0x15f9b4;
    testing::Message::Message((Message *)&local_a8);
    if (local_128.values.
        super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      message = "";
    }
    else {
      message = (char *)(local_128.values.
                         super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->index;
    }
    alStack_140[2] = 0x15f9e8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x49,message);
    alStack_140[2] = 0x15f9fd;
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_a8);
    alStack_140[2] = 0x15fa0a;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_a8.index != (long *)0x0) {
      alStack_140[2] = 0x15fa1f;
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_a8.index != (long *)0x0)) {
        alStack_140[2] = 0x15fa36;
        (**(code **)(*(long *)local_a8.index + 8))();
      }
      local_a8.index = 0;
    }
  }
  alStack_140[2] = 0x15fa4e;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_128.values.
            super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
            ._M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_d8.values.
      super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_140[2] = 0x15fa65;
    operator_delete(local_d8.values.
                    super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.values.
                          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.values.
                          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  alStack_140[2] = 0x15fa72;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_70.cols);
  return;
}

Assistant:

TEST(ColMatrix, AddColumnAndValuesToNonEmptyMatrix) {
  ColMatrix m(3, 3,
              {{{0, 7}, {2, -3}, {1, 0.0}},
               {{0, 2}, {1, 3}, {2, 4}},
               {{0, 1}, {1, -1}, {2, -2}}});
  const SVector new_col = {{0, 1.0}, {2, 2.0}, {3, 3.0}};
  m.add_column(new_col);
  EXPECT_EQ(new_col, m.column(3));
}